

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgFunctionGenerator.hpp
# Opt level: O0

void __thiscall
rsg::FunctionGenerator::requireAssignment(FunctionGenerator *this,Variable *variable)

{
  Variable *local_18;
  Variable *variable_local;
  FunctionGenerator *this_local;
  
  local_18 = variable;
  variable_local = (Variable *)this;
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::push_back
            (&this->m_requiredAssignments,&local_18);
  return;
}

Assistant:

void					requireAssignment			(Variable* variable) { m_requiredAssignments.push_back(variable); }